

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O3

bool __thiscall internalJSONNode::IsEqualTo(internalJSONNode *this,internalJSONNode *val)

{
  uchar uVar1;
  uint uVar2;
  size_t sVar3;
  JSONNode **ppJVar4;
  JSONNode **ppJVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  double dVar10;
  
  if (this == val) {
    return true;
  }
  uVar1 = this->_type;
  if (((uVar1 == val->_type) &&
      (sVar3 = (this->_name)._M_string_length, sVar3 == (val->_name)._M_string_length)) &&
     ((sVar3 == 0 ||
      (iVar7 = bcmp((this->_name)._M_dataplus._M_p,(val->_name)._M_dataplus._M_p,sVar3), iVar7 == 0)
      ))) {
    if (uVar1 == '\0') {
      return true;
    }
    Fetch(this);
    Fetch(val);
    uVar1 = this->_type;
    if (uVar1 == '\x03') {
      return (val->_value)._bool == (this->_value)._bool;
    }
    if (uVar1 == '\x02') {
      dVar10 = (val->_value)._number - (this->_value)._number;
      if ((val->_value)._number <= (this->_value)._number) {
        return -1e-05 < dVar10;
      }
      return dVar10 < 1e-05;
    }
    if (uVar1 == '\x01') {
      sVar3 = (val->_string)._M_string_length;
      if (sVar3 == (this->_string)._M_string_length) {
        if (sVar3 == 0) {
          return true;
        }
        iVar7 = bcmp((val->_string)._M_dataplus._M_p,(this->_string)._M_dataplus._M_p,sVar3);
        return iVar7 == 0;
      }
    }
    else {
      uVar2 = this->Children->mysize;
      if (uVar2 == val->Children->mysize) {
        if ((ulong)uVar2 == 0) {
          return true;
        }
        ppJVar4 = this->Children->array;
        ppJVar5 = val->Children->array;
        lVar8 = 0;
        do {
          bVar6 = IsEqualTo((internalJSONNode *)**(undefined8 **)((long)ppJVar4 + lVar8),
                            (internalJSONNode *)**(undefined8 **)((long)ppJVar5 + lVar8));
          if (!bVar6) {
            return bVar6;
          }
          bVar9 = (ulong)uVar2 * 8 + -8 != lVar8;
          lVar8 = lVar8 + 8;
        } while (bVar9);
        return bVar6;
      }
    }
  }
  return false;
}

Assistant:

bool internalJSONNode::IsEqualTo(const internalJSONNode * val) const json_nothrow {
    if (this == val) return true;  //same internal object, so they must be equal (not only for ref counting)
    if (type() != val -> type()) return false;	 //aren't even same type
    if (_name != val -> _name) return false;  //names aren't the same
    if (type() == JSON_NULL) return true;  //both null, can't be different
    #if !defined(JSON_PREPARSE) && defined(JSON_READ_PRIORITY) 
	   Fetch();
	   val -> Fetch();
    #endif 
    switch (type()){
	   case JSON_STRING:
		  return val -> _string == _string;
	   case JSON_NUMBER:
		  return _floatsAreEqual(val -> _value._number, _value._number);
	   case JSON_BOOL:
		  return val -> _value._bool == _value._bool;
    };

    JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, JSON_TEXT("Checking for equality, not sure what type"));
    if (CHILDREN -> size() != val -> CHILDREN -> size()) return false;  //if they arne't he same size then they certainly aren't equal

    //make sure each children is the same
    JSONNode ** valrunner = val -> CHILDREN -> begin();
    json_foreach(CHILDREN, myrunner){
        JSON_ASSERT(*myrunner != NULL, json_global(ERROR_NULL_IN_CHILDREN));
		JSON_ASSERT(*valrunner != NULL, json_global(ERROR_NULL_IN_CHILDREN));
		JSON_ASSERT(valrunner != val -> CHILDREN -> end(), JSON_TEXT("at the end of other one's children, but they're the same size?"));
        if (**myrunner != **valrunner) return false;
		++valrunner;
    }
    return true;
}